

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::EnumNextPrevMethod::eval
          (EnumNextPrevMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  size_type sVar2;
  uint *puVar3;
  ConstantValue *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  long in_RSI;
  ConstantValue *in_RDI;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  sVar4;
  uint32_t i;
  SVInt offset;
  SVInt size;
  ConstantValue *cv;
  EnumValueSymbol *enumerand;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __end3;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __begin3;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  *__range3;
  size_t current;
  SVInt *targetInt;
  EnumType *type;
  SmallVector<const_slang::ast::EnumValueSymbol_*,_5UL> values;
  optional<unsigned_long> foundIndex;
  ConstantValue countCv;
  SVInt count;
  SVInt one;
  ConstantValue val;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  EvalContext *in_stack_fffffffffffffce0;
  Type *in_stack_fffffffffffffce8;
  SVInt *in_stack_fffffffffffffcf0;
  SVInt *in_stack_fffffffffffffcf8;
  SVInt *in_stack_fffffffffffffd00;
  SVInt *in_stack_fffffffffffffd08;
  undefined6 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1e;
  logic_t in_stack_fffffffffffffd1f;
  SVInt *in_stack_fffffffffffffde0;
  SVInt *in_stack_fffffffffffffde8;
  EnumValueSymbol *in_stack_fffffffffffffe08;
  SourceRange in_stack_fffffffffffffe10;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  local_140;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  *local_130;
  long local_128;
  SVInt *local_120;
  EnumType *local_118;
  SmallVectorBase<const_slang::ast::EnumValueSymbol_*> local_110 [4];
  SVInt local_88 [2];
  uint local_68;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_30;
  
  local_30 = in_RCX;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval((Expression *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8d7a00);
  if (!bVar1) {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffce0,
               (nullptr_t)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
    local_68 = 1;
    goto LAB_008d8377;
  }
  SVInt::SVInt(in_stack_fffffffffffffcf0,(bitwidth_t)((ulong)in_stack_fffffffffffffce8 >> 0x20),
               (uint64_t)in_stack_fffffffffffffce0,(bool)in_stack_fffffffffffffcdf);
  SVInt::SVInt((SVInt *)in_stack_fffffffffffffce0,
               (SVInt *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
  sVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x8d7a94);
  if (sVar2 == 2) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](local_30,1);
    Expression::eval((Expression *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8d7ad7);
    if (bVar1) {
      slang::ConstantValue::integer((ConstantValue *)0x8d7b75);
      SVInt::operator=((SVInt *)in_stack_fffffffffffffce8,(SVInt *)in_stack_fffffffffffffce0);
      SVInt::resize(in_stack_fffffffffffffcf8,(bitwidth_t)((ulong)in_stack_fffffffffffffcf0 >> 0x20)
                   );
      SVInt::operator=((SVInt *)in_stack_fffffffffffffce8,(SVInt *)in_stack_fffffffffffffce0);
      SVInt::~SVInt(in_stack_fffffffffffffcf0);
      SVInt::setSigned(local_88,true);
    }
    else {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffce0,
                 (nullptr_t)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
    }
    local_68 = (uint)!bVar1;
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x8d7c10);
    if (local_68 == 0) goto LAB_008d7c23;
  }
  else {
LAB_008d7c23:
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x8d7c30);
    SmallVector<const_slang::ast::EnumValueSymbol_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::EnumValueSymbol_*,_5UL> *)0x8d7c3d);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](local_30,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x8d7c5a);
    Type::getCanonicalType((Type *)in_stack_fffffffffffffce0);
    local_118 = Symbol::as<slang::ast::EnumType>((Symbol *)0x8d7c79);
    local_120 = slang::ConstantValue::integer((ConstantValue *)0x8d7ca0);
    local_128 = 0;
    sVar4 = EnumType::values((EnumType *)0x8d7cd3);
    local_130 = &local_140;
    local_140 = sVar4;
    std::ranges::
    subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
    ::begin(local_130);
    std::ranges::
    subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
    ::end(local_130);
    while( true ) {
      bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                        ((self_type *)in_stack_fffffffffffffce0,
                         (specific_symbol_iterator<slang::ast::EnumValueSymbol> *)
                         CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
      ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                   *)0x8d7d70);
      SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffce0);
      EnumValueSymbol::getValue(in_stack_fffffffffffffe08,in_stack_fffffffffffffe10);
      bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8d7ddb);
      if (!bVar1) {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffce0,
                   (nullptr_t)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
        local_68 = 1;
        goto LAB_008d8321;
      }
      slang::ConstantValue::integer((ConstantValue *)0x8d7e34);
      in_stack_fffffffffffffd1f =
           SVInt::operator==(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      in_stack_fffffffffffffd1e =
           logic_t::operator_cast_to_bool((logic_t *)in_stack_fffffffffffffce0);
      if ((bool)in_stack_fffffffffffffd1e) {
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)in_stack_fffffffffffffce0,
                   (unsigned_long *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
      }
      SmallVectorBase<const_slang::ast::EnumValueSymbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::EnumValueSymbol_*> *)in_stack_fffffffffffffce0,
                 (EnumValueSymbol **)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
      local_128 = local_128 + 1;
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
      ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                  *)in_stack_fffffffffffffce0);
    }
    bVar1 = SmallVectorBase<const_slang::ast::EnumValueSymbol_*>::empty(local_110);
    if (bVar1) {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffce0,
                 (nullptr_t)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
      local_68 = 1;
    }
    else {
      bVar1 = std::optional<unsigned_long>::has_value((optional<unsigned_long> *)0x8d7f42);
      if (bVar1) {
        if ((*(byte *)(in_RSI + 0x38) & 1) == 0) {
          SVInt::operator-((SVInt *)CONCAT17(in_stack_fffffffffffffd1f.value,
                                             CONCAT16(in_stack_fffffffffffffd1e,
                                                      in_stack_fffffffffffffd18)));
          SVInt::operator=((SVInt *)in_stack_fffffffffffffce8,(SVInt *)in_stack_fffffffffffffce0);
          SVInt::~SVInt(in_stack_fffffffffffffcf0);
        }
        SmallVectorBase<const_slang::ast::EnumValueSymbol_*>::size(local_110);
        SVInt::SVInt(in_stack_fffffffffffffcf0,
                     (bitwidth_t)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (uint64_t)in_stack_fffffffffffffce0,(bool)in_stack_fffffffffffffcdf);
        std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x8d7fea);
        SVInt::SVInt(in_stack_fffffffffffffcf0,
                     (bitwidth_t)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (uint64_t)in_stack_fffffffffffffce0,(bool)in_stack_fffffffffffffcdf);
        SVInt::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
        SVInt::~SVInt(in_stack_fffffffffffffcf0);
        SVInt::operator/(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        SVInt::operator-(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
        SVInt::operator*(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
        SVInt::operator+=((SVInt *)sVar4._M_begin.current.current,
                          (SVInt *)sVar4._M_end.current.current);
        SVInt::~SVInt(in_stack_fffffffffffffcf0);
        SVInt::~SVInt(in_stack_fffffffffffffcf0);
        SVInt::~SVInt(in_stack_fffffffffffffcf0);
        SmallVectorBase<const_slang::ast::EnumValueSymbol_*>::size(local_110);
        SVInt::SVInt(in_stack_fffffffffffffcf0,
                     (bitwidth_t)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (uint64_t)in_stack_fffffffffffffce0,(bool)in_stack_fffffffffffffcdf);
        SVInt::operator%(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        SVInt::operator=((SVInt *)in_stack_fffffffffffffce8,(SVInt *)in_stack_fffffffffffffce0);
        SVInt::~SVInt(in_stack_fffffffffffffcf0);
        SVInt::~SVInt(in_stack_fffffffffffffcf0);
        SVInt::as<unsigned_int>(in_stack_fffffffffffffcf8);
        puVar3 = std::optional<unsigned_int>::value
                           ((optional<unsigned_int> *)in_stack_fffffffffffffce0);
        in_stack_fffffffffffffcf0 =
             (SVInt *)SmallVectorBase<const_slang::ast::EnumValueSymbol_*>::operator[]
                                (local_110,(ulong)*puVar3);
        SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffce0);
        this_00 = EnumValueSymbol::getValue(in_stack_fffffffffffffe08,in_stack_fffffffffffffe10);
        slang::ConstantValue::ConstantValue
                  (this_00,(ConstantValue *)
                           CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
        local_68 = 1;
        SVInt::~SVInt(in_stack_fffffffffffffcf0);
        SVInt::~SVInt(in_stack_fffffffffffffcf0);
      }
      else {
        Type::getDefaultValue(in_stack_fffffffffffffce8);
        local_68 = 1;
      }
    }
LAB_008d8321:
    SmallVector<const_slang::ast::EnumValueSymbol_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::EnumValueSymbol_*,_5UL> *)0x8d832e);
  }
  SVInt::~SVInt(in_stack_fffffffffffffcf0);
  SVInt::~SVInt(in_stack_fffffffffffffcf0);
LAB_008d8377:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x8d8384);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto val = args[0]->eval(context);
        if (!val)
            return nullptr;

        // Count defaults to 1, but can optionally be passed in.
        SVInt one(33, 1, true);
        SVInt count = one;
        if (args.size() == 2) {
            auto countCv = args[1]->eval(context);
            if (!countCv)
                return nullptr;

            // Convert to a signed 33-bit number for delta computation.
            count = countCv.integer();
            count = count.resize(33);
            count.setSigned(true);
        }

        std::optional<size_t> foundIndex;
        SmallVector<const EnumValueSymbol*> values;
        const EnumType& type = args[0]->type->getCanonicalType().as<EnumType>();
        auto& targetInt = val.integer();

        // Get all values into an array for easier handling. Along the way,
        // try to find the current value among the enum members.
        size_t current = 0;
        for (auto& enumerand : type.values()) {
            auto& cv = enumerand.getValue();
            if (!cv)
                return nullptr;

            if (cv.integer() == targetInt)
                foundIndex = current;

            values.push_back(&enumerand);
            current++;
        }

        if (values.empty())
            return nullptr;

        // If the current value is not in the set of enumerands, the spec
        // says we should return the default value.
        if (!foundIndex.has_value())
            return type.getDefaultValue();

        if (!next)
            count = -count;

        // Handle wraparound for both zero and the size of the array.
        SVInt size(33, values.size(), true);
        SVInt offset = SVInt(33, *foundIndex, true) + count;
        offset += (one - offset / size) * size;

        count = offset % SVInt(33, values.size(), true);
        uint32_t i = count.as<uint32_t>().value();
        return values[i]->getValue();
    }